

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O2

void __thiscall
TPZGeoMesh::BuildElementsAroundNode
          (TPZGeoMesh *this,int64_t currentnode,
          map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
          *elmap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type pTVar3;
  int iVar4;
  uint uVar5;
  iterator iVar6;
  long lVar7;
  mapped_type *ppTVar8;
  iterator __position;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  _Self __tmp;
  TPZGeoElSide neigh;
  _Base_ptr local_68;
  int64_t local_50;
  undefined1 local_48 [8];
  mapped_type local_40;
  int local_38;
  
  p_Var1 = &(elmap->_M_t)._M_impl.super__Rb_tree_header;
  iVar6._M_node = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (__position._M_node = iVar6._M_node, (_Rb_tree_header *)__position._M_node != p_Var1) {
    p_Var2 = __position._M_node[1]._M_parent;
    iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    iVar4 = (**(code **)(*(long *)p_Var2 + 0x90))(p_Var2);
    uVar12 = (ulong)iVar4;
    uVar10 = 0;
    if (0 < (long)uVar12) {
      uVar10 = uVar12;
    }
    uVar9 = 0;
    while ((uVar13 = uVar10, uVar10 != uVar9 &&
           (lVar7 = (**(code **)(*(long *)p_Var2 + 0xa8))(p_Var2,uVar9 & 0xffffffff), uVar13 = uVar9
           , lVar7 != currentnode))) {
      uVar9 = uVar9 + 1;
    }
    if (uVar13 == uVar12) {
      std::
      _Rb_tree<long,std::pair<long_const,TPZGeoEl*>,std::_Select1st<std::pair<long_const,TPZGeoEl*>>,std::less<long>,std::allocator<std::pair<long_const,TPZGeoEl*>>>
      ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,TPZGeoEl*>,std::_Select1st<std::pair<long_const,TPZGeoEl*>>,std::less<long>,std::allocator<std::pair<long_const,TPZGeoEl*>>>
                          *)elmap,__position);
    }
  }
  local_68 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)local_68 == p_Var1) {
      return;
    }
    p_Var2 = local_68[1]._M_parent;
    local_68 = (_Base_ptr)std::_Rb_tree_increment(local_68);
    iVar4 = (**(code **)(*(long *)p_Var2 + 0xf0))(p_Var2);
    iVar11 = 0;
    if (iVar4 < 1) {
      iVar4 = iVar11;
    }
    for (; iVar11 != iVar4; iVar11 = iVar11 + 1) {
      (**(code **)(*(long *)p_Var2 + 0x188))(local_48,p_Var2,iVar11);
      if ((local_40 != (mapped_type)0x0) && (-1 < local_38)) {
        uVar5 = (**(code **)(*(long *)local_40 + 0x90))();
        uVar10 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar10 = 0;
        }
        uVar12 = 0;
        do {
          if (uVar10 == uVar12) goto LAB_0101301f;
          lVar7 = (**(code **)(*(long *)local_40 + 0xa8))(local_40,uVar12 & 0xffffffff);
          uVar12 = uVar12 + 1;
        } while (lVar7 != currentnode);
        local_50 = local_40->fId;
        iVar6 = std::
                _Rb_tree<long,_std::pair<const_long,_TPZGeoEl_*>,_std::_Select1st<std::pair<const_long,_TPZGeoEl_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                ::find(&elmap->_M_t,&local_50);
        pTVar3 = local_40;
        if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
          local_50 = local_40->fId;
          ppTVar8 = std::
                    map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                    ::operator[](elmap,&local_50);
          *ppTVar8 = pTVar3;
          local_68 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        }
      }
LAB_0101301f:
    }
  } while( true );
}

Assistant:

void TPZGeoMesh::BuildElementsAroundNode(int64_t currentnode,map<int64_t,TPZGeoEl*> &elmap)
{
	// first eliminate all elements which do not contain currentnode
	//TPZPix iel = elmap.First();
	map<int64_t, TPZGeoEl *>::iterator ielprev,iel=elmap.begin();
	TPZGeoEl *el;
	int64_t i;
	while(iel!=elmap.end())
	{
		el = iel->second;
		ielprev=iel;
		iel++;//elmap.Next(iel);
		int numnode = el->NNodes();
		for(i=0; i< numnode; i++)
		{
			if(el->NodeIndex(i) == currentnode) break;
		}
		if(i == numnode)
		{
			elmap.erase(ielprev);
		}
	}
	iel = elmap.begin();
	while(iel!=elmap.end())
	{
		el = iel->second;//elmap.Contents(iel);
		iel++;//elmap.Next(iel);
		int nside = el->NSides();
		for(int is=0; is<nside; is++)
		{
			TPZGeoElSide neigh = el->Neighbour(is);
			if(!neigh.Exists()) continue;
			int numnode = neigh.Element()->NNodes();
			for(i=0; i< numnode; i++)
			{
				if(neigh.Element()->NodeIndex(i) == currentnode)
				{
					if(elmap.find(neigh.Element()->Id())==elmap.end())
					{
						// this should be implemented as a stack, so that we dont have to
						// go through the list again each time
						elmap[neigh.Element()->Id()] = neigh.Element();
						iel = elmap.begin();
					}
					break;	// get out of the loop over the nodes
				}
			}
		}
	}
}